

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswMan.c
# Opt level: O2

Ssw_Man_t * Ssw_ManCreate(Aig_Man_t *pAig,Ssw_Pars_t *pPars)

{
  uint uVar1;
  Ssw_Man_t *pSVar2;
  Aig_Obj_t **ppAVar3;
  Vec_Ptr_t *pVVar4;
  uint *puVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  int iVar8;
  size_t sVar9;
  long lVar10;
  
  if (0 < pAig->nRegs) {
    Aig_ManFanoutStart(pAig);
    Aig_ManSetCioIds(pAig);
    pSVar2 = (Ssw_Man_t *)calloc(1,0x1a8);
    pSVar2->pPars = pPars;
    pSVar2->pAig = pAig;
    lVar10 = (long)pPars->nFramesK + 1;
    iVar8 = (int)lVar10;
    pSVar2->nFrames = iVar8;
    sVar9 = pAig->vObjs->nSize * lVar10;
    ppAVar3 = (Aig_Obj_t **)calloc(sVar9,8);
    pSVar2->pNodeToFrames = ppAVar3;
    pVVar4 = Vec_PtrAlloc((int)sVar9);
    pSVar2->vCommon = pVVar4;
    pSVar2->iOutputLit = -1;
    uVar1 = pAig->nTruePis * iVar8 + pAig->nRegs;
    iVar8 = (((int)uVar1 >> 5) + 1) - (uint)((uVar1 & 0x1f) == 0);
    pSVar2->nPatWords = iVar8;
    sVar9 = (size_t)iVar8;
    puVar5 = (uint *)calloc(sVar9,4);
    pSVar2->pPatWords = puVar5;
    pVVar4 = Vec_PtrAlloc((int)sVar9);
    pSVar2->vNewLos = pVVar4;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    pVVar6->nCap = 100;
    pVVar6->nSize = 0;
    iVar8 = 400;
    piVar7 = (int *)malloc(400);
    pVVar6->pArray = piVar7;
    pSVar2->vNewPos = pVVar6;
    pVVar4 = Vec_PtrAlloc(iVar8);
    pSVar2->vResimConsts = pVVar4;
    pVVar4 = Vec_PtrAlloc(iVar8);
    pSVar2->vResimClasses = pVVar4;
    return pSVar2;
  }
  __assert_fail("Saig_ManRegNum(pAig) > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswMan.c"
                ,0x31,"Ssw_Man_t *Ssw_ManCreate(Aig_Man_t *, Ssw_Pars_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates the manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Ssw_Man_t * Ssw_ManCreate( Aig_Man_t * pAig, Ssw_Pars_t * pPars )
{
    Ssw_Man_t * p;
    // prepare the sequential AIG
    assert( Saig_ManRegNum(pAig) > 0 );
    Aig_ManFanoutStart( pAig );
    Aig_ManSetCioIds( pAig );
    // create interpolation manager
    p = ABC_ALLOC( Ssw_Man_t, 1 );
    memset( p, 0, sizeof(Ssw_Man_t) );
    p->pPars         = pPars;
    p->pAig          = pAig;
    p->nFrames       = pPars->nFramesK + 1;
    p->pNodeToFrames = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p->pAig) * p->nFrames );
    p->vCommon       = Vec_PtrAlloc( 100 );
    p->iOutputLit    = -1;
    // allocate storage for sim pattern
    p->nPatWords     = Abc_BitWordNum( Saig_ManPiNum(pAig) * p->nFrames + Saig_ManRegNum(pAig) );
    p->pPatWords     = ABC_CALLOC( unsigned, p->nPatWords );
    // other
    p->vNewLos       = Vec_PtrAlloc( 100 );
    p->vNewPos       = Vec_IntAlloc( 100 );
    p->vResimConsts  = Vec_PtrAlloc( 100 );
    p->vResimClasses = Vec_PtrAlloc( 100 );
//    p->pPars->fVerbose = 1;
    return p;
}